

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

anytype_t * ps_config_set(ps_config_t *config,char *name,anytype_t *val,ps_type_t t)

{
  ps_type_t t_local;
  anytype_t *val_local;
  char *name_local;
  ps_config_t *config_local;
  
  if (val == (anytype_t *)0x0) {
    config_local = (ps_config_t *)ps_config_unset(config,name);
  }
  else if ((t & ARG_STRING) == 0) {
    if ((t & ARG_INTEGER) == 0) {
      if ((t & ARG_BOOLEAN) == 0) {
        if ((t & ARG_FLOATING) == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0x28b,"Value has unknown type %d\n",name,(ulong)t);
          config_local = (ps_config_t *)0x0;
        }
        else {
          config_local = (ps_config_t *)ps_config_set_bool(config,name,(int)val->fl);
        }
      }
      else {
        config_local = (ps_config_t *)ps_config_set_bool(config,name,(int)val->i);
      }
    }
    else {
      config_local = (ps_config_t *)ps_config_set_int(config,name,val->i);
    }
  }
  else {
    config_local = (ps_config_t *)ps_config_set_str(config,name,(char *)val->ptr);
  }
  return (anytype_t *)config_local;
}

Assistant:

const anytype_t *
ps_config_set(ps_config_t *config, const char *name, const anytype_t *val, ps_type_t t)
{
    if (val == NULL) {
        /* Restore default parameter */
        return ps_config_unset(config, name);
    }
    else if (t & ARG_STRING)
        return ps_config_set_str(config, name, val->ptr);
    else if (t & ARG_INTEGER)
        return ps_config_set_int(config, name, val->i);
    else if (t & ARG_BOOLEAN)
        return ps_config_set_bool(config, name, val->i);
    else if (t & ARG_FLOATING)
        return ps_config_set_bool(config, name, val->fl);
    else {
        E_ERROR("Value has unknown type %d\n", name, t);
        return NULL;
    }
}